

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnceReduction.cpp
# Opt level: O3

void __thiscall wasm::OnceReduction::run(OnceReduction *this,Module *module)

{
  __node_base_ptr *this_00;
  __node_base_ptr *this_01;
  pointer puVar1;
  Global *__k;
  pointer puVar2;
  pointer puVar3;
  Export *pEVar4;
  Expression *pEVar5;
  uintptr_t uVar6;
  undefined1 *puVar7;
  size_t sVar8;
  bool bVar9;
  uint uVar10;
  Nop *output_2;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *p_Var13;
  size_type sVar14;
  undefined8 *puVar15;
  Nop *output_1;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  pointer puVar16;
  long *plVar17;
  pointer puVar18;
  variant<wasm::Name,_wasm::HeapType> *__k_00;
  uint uVar19;
  Nop *output;
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  *__range2_1;
  key_type *__k_01;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  pointer puVar20;
  __int_type _Var21;
  undefined1 auStack_3c8 [8];
  mapped_type global_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  _Stack_398;
  bool local_378;
  Expression **local_370;
  size_t sStack_368;
  pointer local_2c0;
  pointer pTStack_2b8;
  pointer local_2b0;
  Function *pFStack_2a8;
  Module *local_2a0;
  undefined1 auStack_298 [40];
  pointer local_270;
  undefined1 auStack_268 [40];
  _Base_ptr local_240;
  _Base_ptr local_238;
  _Base_ptr local_230;
  undefined1 local_228 [192];
  _Rb_tree_node_base local_168;
  size_t local_148;
  undefined1 *local_140;
  undefined1 local_130 [8];
  OptInfo optInfo;
  _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_40;
  Module *local_38;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  
  local_130 = (undefined1  [8])&optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobals._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceGlobals._M_h._M_bucket_count = 0;
  optInfo.onceGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobals._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobals._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobals._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceGlobals._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceFuncs._M_h._M_bucket_count = 0;
  optInfo.onceFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.onceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket =
       (__node_base_ptr)&optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_buckets = (__buckets_ptr)0x1;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_bucket_count = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_element_count._0_4_ = 0x3f800000;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._4_4_ = 0;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_rehash_policy._M_next_resize = 0;
  puVar20 = (module->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (module->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket = (__node_base_ptr)this;
  local_38 = module;
  if (puVar20 != puVar1) {
    do {
      __k = (puVar20->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
            _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
            super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (((__k->type).id & 0xfffffffffffffffe) == 2) {
        _Var21 = *(char **)((long)&(__k->super_Importable).module + 8) == (char *)0x0;
      }
      else {
        _Var21 = false;
      }
      pmVar11 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_130,(key_type *)__k);
      LOCK();
      (pmVar11->_M_base)._M_i = _Var21;
      UNLOCK();
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar1);
  }
  this_01 = &optInfo.onceGlobals._M_h._M_single_bucket;
  puVar2 = (local_38->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (local_38->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar2; puVar18 = puVar18 + 1
      ) {
    pmVar12 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,
                           (key_type *)
                           (puVar18->_M_t).
                           super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                           .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    (pmVar12->super_IString).str._M_len = 0;
    (pmVar12->super_IString).str._M_str = (char *)0x0;
  }
  puVar16 = (local_38->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (local_38->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != puVar3) {
    do {
      pEVar4 = (puVar16->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar4->kind == Global) {
        if (*(__index_type *)
             ((long)&(pEVar4->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          __k_00 = &pEVar4->value;
        }
        else {
          __k_00 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        pmVar11 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_130,(key_type *)__k_00);
        LOCK();
        (pmVar11->_M_base)._M_i = false;
        UNLOCK();
      }
      puVar16 = puVar16 + 1;
    } while (puVar16 != puVar3);
  }
  global_1.super_IString.str._M_str = (char *)&local_3a8;
  local_3a8._M_allocated_capacity._0_4_ = local_3a8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_378 = false;
  local_370 = (Expression **)0x0;
  sStack_368 = 0;
  local_2c0 = (pointer)0x0;
  pTStack_2b8 = (pointer)0x0;
  local_2b0 = (pointer)0x0;
  pFStack_2a8 = (Function *)0x0;
  local_2a0 = (Module *)0x0;
  auStack_3c8 = (undefined1  [8])&PTR__Scanner_010741b8;
  auStack_298._0_8_ = auStack_268;
  auStack_298._8_8_ = (BasicBlock *)0x1;
  auStack_298._16_8_ = (_Hash_node_base *)0x0;
  auStack_298._24_8_ = (pointer)0x0;
  auStack_298._32_4_ = 1.0;
  local_270 = (pointer)0x0;
  auStack_268._0_8_ = (__node_base_ptr)0x0;
  auStack_268._8_8_ = local_130;
  global_1.super_IString.str._M_len =
       (size_t)optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket[1]._M_nxt;
  WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::Scanner,_wasm::Visitor<wasm::(anonymous_namespace)::Scanner,_void>_>_>
         *)auStack_3c8,local_38);
  auStack_3c8 = (undefined1  [8])&PTR__Scanner_010741b8;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_298);
  if (local_2c0 != (pointer)0x0) {
    operator_delete(local_2c0,(long)local_2b0 - (long)local_2c0);
  }
  Pass::~Pass((Pass *)auStack_3c8);
  if (optInfo.onceFuncs._M_h._M_bucket_count != 0) {
    plVar17 = (long *)optInfo.onceFuncs._M_h._M_bucket_count;
    do {
      if (plVar17[4] != 0) {
        pmVar11 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_130,(key_type *)(plVar17 + 3));
        if (((pmVar11->_M_base)._M_i & 1U) == 0) {
          (((key_type *)(plVar17 + 3))->super_IString).str._M_len = 0;
          plVar17[4] = 0;
        }
      }
      plVar17 = (long *)*plVar17;
    } while (plVar17 != (long *)0x0);
  }
  this_00 = &optInfo.onceGlobalsSetInFuncs._M_h._M_single_bucket;
  puVar18 = (local_38->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (local_38->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar8 = global_1.super_IString.str._M_len;
  if (puVar18 != puVar2) {
    bVar9 = false;
    do {
      while( true ) {
        p_Var13 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   *)std::__detail::
                     _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&optInfo.onceFuncs._M_h._M_single_bucket,
                                  (key_type *)
                                  (puVar18->_M_t).
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        pmVar12 = std::__detail::
                  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_01,
                               (key_type *)
                               (puVar18->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
        auStack_3c8 = (undefined1  [8])(pmVar12->super_IString).str._M_len;
        global_1.super_IString.str._M_len = (size_t)(pmVar12->super_IString).str._M_str;
        if ((char *)global_1.super_IString.str._M_len != (char *)0x0) break;
        puVar18 = puVar18 + 1;
        if (puVar18 == puVar2) {
          sVar8 = 0;
          if (!bVar9) goto LAB_009a1ef9;
          goto LAB_009a1c60;
        }
      }
      local_40 = p_Var13;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                (p_Var13,auStack_3c8,&local_40);
      puVar18 = puVar18 + 1;
      bVar9 = true;
    } while (puVar18 != puVar2);
LAB_009a1c60:
    uVar19 = 0;
    do {
      puVar2 = (local_38->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar18 = (local_38->functions).
                     super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar2;
          puVar18 = puVar18 + 1) {
        std::__detail::
        _Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
        ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)this_00,
                     (key_type *)
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      }
      global_1.super_IString.str._M_str = (char *)&local_3a8;
      local_3a8._M_allocated_capacity._0_4_ = local_3a8._M_allocated_capacity._0_4_ & 0xffffff00;
      local_378 = false;
      local_370 = (Expression **)0x0;
      sStack_368 = 0;
      auStack_268._32_4_ = _S_red;
      local_240 = (_Base_ptr)0x0;
      auStack_268._8_8_ = (pointer)0x0;
      local_270 = (pointer)0x0;
      auStack_268._0_8_ = (__node_base_ptr)0x0;
      auStack_298._24_8_ = (pointer)0x0;
      auStack_298._32_8_ = (pointer)0x0;
      auStack_298._8_8_ = (BasicBlock *)0x0;
      auStack_298._16_8_ = (_Hash_node_base *)0x0;
      local_2a0 = (Module *)0x0;
      auStack_298._0_8_ = (BasicBlock *)0x0;
      local_2b0 = (pointer)0x0;
      pFStack_2a8 = (Function *)0x0;
      local_2c0 = (pointer)0x0;
      pTStack_2b8 = (pointer)0x0;
      local_238 = (_Base_ptr)(auStack_268 + 0x20);
      local_168._M_color = _S_red;
      local_168._M_parent = (_Base_ptr)0x0;
      local_230 = local_238;
      memset(local_228,0,0xb2);
      local_168._M_left = &local_168;
      local_148 = 0;
      auStack_3c8 = (undefined1  [8])&PTR__WalkerPass_01074218;
      local_140 = local_130;
      global_1.super_IString.str._M_len =
           (size_t)optInfo.newOnceGlobalsSetInFuncs._M_h._M_single_bucket[1]._M_nxt;
      local_168._M_right = local_168._M_left;
      WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ::run((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
             *)auStack_3c8,local_38);
      WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
      ::~WalkerPass((WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::Optimizer,_wasm::Visitor<wasm::(anonymous_namespace)::Optimizer,_void>,_wasm::(anonymous_namespace)::BlockInfo>_>
                     *)auStack_3c8);
      std::
      _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&optInfo.onceFuncs._M_h._M_single_bucket);
      uVar10 = 0;
      for (puVar15 = (undefined8 *)optInfo.onceGlobalsSetInFuncs._M_h._M_bucket_count;
          puVar15 != (undefined8 *)0x0; puVar15 = (undefined8 *)*puVar15) {
        uVar10 = uVar10 + *(int *)(puVar15 + 6);
      }
      if (uVar10 < uVar19) {
        __assert_fail("currOnceGlobalsSet >= lastOnceGlobalsSet",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OnceReduction.cpp"
                      ,0x1b4,"virtual void wasm::OnceReduction::run(Module *)");
      }
      bVar9 = uVar19 < uVar10;
      uVar19 = uVar10;
    } while (bVar9);
    puVar18 = (local_38->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (local_38->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    auStack_3c8 = (undefined1  [8])&_Stack_398;
    global_1.super_IString.str._M_len = 1;
    global_1.super_IString.str._M_str = (char *)0x0;
    local_3a8._M_allocated_capacity._0_4_ = 0x3f800000;
    local_3a8._8_8_ = 0;
    _Stack_398._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
    for (; puVar18 != puVar2; puVar18 = puVar18 + 1) {
      pmVar12 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&optInfo.onceGlobals._M_h._M_single_bucket,
                     (key_type *)
                     (puVar18->_M_t).
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
      if ((pmVar12->super_IString).str._M_str != (char *)0x0) {
        pEVar5 = ((puVar18->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->body;
        if (pEVar5->_id != BlockId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::Block]");
        }
        uVar6 = pEVar5[2].type.id;
        if (uVar6 == 3) {
          if (**(char **)(*(long *)(pEVar5 + 2) + 0x10) == '\x06') {
            __k_01 = (key_type *)(*(char **)(*(long *)(pEVar5 + 2) + 0x10) + 0x30);
            pmVar12 = std::__detail::
                      _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&optInfo.onceGlobals._M_h._M_single_bucket,__k_01);
            if (((pmVar12->super_IString).str._M_str != (char *)0x0) &&
               (sVar14 = std::
                         _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                  *)auStack_3c8,__k_01), sVar14 == 0)) {
              uVar6 = pEVar5[2].type.id;
              if (uVar6 == 0) {
LAB_009a1f71:
                __assert_fail("index < usedElements",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                              ,0xbc,
                              "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                             );
              }
              puVar15 = *(undefined8 **)(pEVar5 + 2);
              puVar7 = (undefined1 *)*puVar15;
              *puVar7 = 0x16;
              *(undefined8 *)(puVar7 + 8) = 0;
              if (uVar6 == 1) goto LAB_009a1f71;
              puVar7 = (undefined1 *)puVar15[1];
              *puVar7 = 0x16;
              *(undefined8 *)(puVar7 + 8) = 0;
              local_40 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)auStack_3c8;
              std::
              _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                        (local_40,(puVar18->_M_t).
                                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                                  .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                         &local_40);
            }
          }
        }
        else if (uVar6 == 2) {
          pEVar5->_id = NopId;
          (pEVar5->type).id = 0;
        }
      }
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)auStack_3c8);
    sVar8 = global_1.super_IString.str._M_len;
  }
LAB_009a1ef9:
  global_1.super_IString.str._M_len = sVar8;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this_00);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&optInfo.onceFuncs._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&optInfo.onceGlobals._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::atomic<bool>_>,_std::allocator<std::pair<const_wasm::Name,_std::atomic<bool>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_130);
  return;
}

Assistant:

void run(Module* module) override {
    OptInfo optInfo;

    // Fill out the initial data.
    for (auto& global : module->globals) {
      // For a global to possibly be "once", it must be an integer, and to not
      // be imported (as a mutable import may be read and written to from the
      // outside). As we scan code we will turn this into false if we see
      // anything that proves the global is not "once".
      // TODO: This limitation could perhaps only be on mutable ones, but
      //       immutable globals will not be considered "once" anyhow as they do
      //       not fit the pattern of being written after the first call.
      // TODO: non-integer types?
      optInfo.onceGlobals[global->name] =
        global->type.isInteger() && !global->imported();
    }
    for (auto& func : module->functions) {
      // Fill in the map so that it can be operated on in parallel.
      optInfo.onceFuncs[func->name] = Name();
    }
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Global) {
        // An exported global cannot be "once" since the outside may read and
        // write to it in ways we are unaware.
        // TODO: See comment above on mutability.
        optInfo.onceGlobals[*ex->getInternalName()] = false;
      }
    }

    // Scan the module to find out which globals and functions are "once".
    Scanner(optInfo).run(getPassRunner(), module);

    // Combine the information. We found which globals appear to be "once", but
    // other information may have proven they are not so, in fact. Specifically,
    // for a function to be "once" we need its global to also be such.
    for (auto& [_, onceGlobal] : optInfo.onceFuncs) {
      if (onceGlobal.is() && !optInfo.onceGlobals[onceGlobal]) {
        onceGlobal = Name();
      }
    }

    // Optimize using what we found. Keep iterating while we find things to
    // optimize, which we estimate using a counter of the total number of once
    // globals set by functions: as that increases, it means we are propagating
    // useful information.
    // TODO: limit # of iterations?
    Index lastOnceGlobalsSet = 0;

    // First, initialize onceGlobalsSetInFuncs for the first iteration, by
    // ensuring each item is present, and adding the "once" global for "once"
    // funcs.
    bool foundOnce = false;
    for (auto& func : module->functions) {
      // Either way, at least fill the data structure for parallel operation.
      auto& set = optInfo.onceGlobalsSetInFuncs[func->name];

      auto global = optInfo.onceFuncs[func->name];
      if (global.is()) {
        set.insert(global);
        foundOnce = true;
      }
    }

    if (!foundOnce) {
      // Nothing to optimize.
      return;
    }

    while (1) {
      // Initialize all the items in the new data structure that will be
      // populated.
      for (auto& func : module->functions) {
        optInfo.newOnceGlobalsSetInFuncs[func->name];
      }

      Optimizer(optInfo).run(getPassRunner(), module);

      optInfo.onceGlobalsSetInFuncs =
        std::move(optInfo.newOnceGlobalsSetInFuncs);

      // Count how many once globals are set, and see if we have any more work
      // to do.
      Index currOnceGlobalsSet = 0;
      for (auto& [_, globals] : optInfo.onceGlobalsSetInFuncs) {
        currOnceGlobalsSet += globals.size();
      }
      assert(currOnceGlobalsSet >= lastOnceGlobalsSet);
      if (currOnceGlobalsSet > lastOnceGlobalsSet) {
        lastOnceGlobalsSet = currOnceGlobalsSet;
        continue;
      }
      break;
    }

    // Finally, apply some optimizations to "once" functions themselves. We do
    // this at the end to not modify them as we go, which could confuse the main
    // part of this pass right before us.
    optimizeOnceBodies(optInfo, module);
  }